

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1c6cb7::CommandLineParser::removeOption(CommandLineParser *this,Option *O)

{
  bool bVar1;
  SubCommand *pSVar2;
  SubCommand *SC_1;
  iterator __end4_1;
  iterator __begin4_1;
  SmallPtrSet<llvm::cl::SubCommand_*,_4U> *__range4_1;
  SubCommand *SC;
  iterator __end4;
  iterator __begin4;
  SmallPtrSet<llvm::cl::SubCommand_*,_4U> *__range4;
  Option *O_local;
  CommandLineParser *this_local;
  
  bVar1 = llvm::SmallPtrSetImplBase::empty((SmallPtrSetImplBase *)&O->Subs);
  if (bVar1) {
    pSVar2 = llvm::
             ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
             ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                          *)llvm::cl::TopLevelSubCommand);
    removeOption(this,O,pSVar2);
  }
  else {
    bVar1 = llvm::cl::Option::isInAllSubCommands(O);
    if (bVar1) {
      join_0x00000010_0x00000000_ =
           (SmallPtrSetIteratorImpl)
           llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::begin
                     (&(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
      _SC = (SmallPtrSetIteratorImpl)
            llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::end
                      (&(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>)
      ;
      while (bVar1 = llvm::SmallPtrSetIteratorImpl::operator!=
                               ((SmallPtrSetIteratorImpl *)&__end4.super_SmallPtrSetIteratorImpl.End
                                ,(SmallPtrSetIteratorImpl *)&SC), bVar1) {
        pSVar2 = llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator*
                           ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)
                            &__end4.super_SmallPtrSetIteratorImpl.End);
        removeOption(this,O,pSVar2);
        llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator++
                  ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)
                   &__end4.super_SmallPtrSetIteratorImpl.End);
      }
    }
    else {
      join_0x00000010_0x00000000_ =
           (SmallPtrSetIteratorImpl)
           llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::begin
                     (&(O->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
      _SC_1 = (SmallPtrSetIteratorImpl)
              llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::end
                        (&(O->Subs).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
      while (bVar1 = llvm::SmallPtrSetIteratorImpl::operator!=
                               ((SmallPtrSetIteratorImpl *)
                                &__end4_1.super_SmallPtrSetIteratorImpl.End,
                                (SmallPtrSetIteratorImpl *)&SC_1), bVar1) {
        pSVar2 = llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator*
                           ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)
                            &__end4_1.super_SmallPtrSetIteratorImpl.End);
        removeOption(this,O,pSVar2);
        llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator++
                  ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)
                   &__end4_1.super_SmallPtrSetIteratorImpl.End);
      }
    }
  }
  return;
}

Assistant:

void removeOption(Option *O) {
    if (O->Subs.empty())
      removeOption(O, &*TopLevelSubCommand);
    else {
      if (O->isInAllSubCommands()) {
        for (auto SC : RegisteredSubCommands)
          removeOption(O, SC);
      } else {
        for (auto SC : O->Subs)
          removeOption(O, SC);
      }
    }
  }